

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execCas<(moira::Core)2,(moira::Instr)143,(moira::Mode)2,1>(Moira *this,u16 opcode)

{
  u32 uVar1;
  u32 uVar2;
  u32 local_28;
  u32 compare;
  u32 data;
  u32 ea;
  int du;
  int dc;
  int dst;
  u16 opcode_local;
  Moira *this_local;
  
  this->cp = 0;
  du = opcode & 7;
  ea = (this->queue).irc & 7;
  data = (int)(uint)(this->queue).irc >> 6 & 7;
  dc._2_2_ = opcode;
  _dst = this;
  readExt<(moira::Core)2>(this);
  readOp<(moira::Core)2,(moira::Mode)2,1,0ull>(this,du,&compare,&local_28);
  uVar1 = readD<4>(this,ea);
  uVar2 = CLIP<1>((ulong)uVar1);
  cmp<(moira::Core)2,1>(this,uVar2,local_28);
  uVar2 = ea;
  if (((this->reg).sr.z & 1U) == 0) {
    uVar1 = CLEAR<1>((ulong)uVar1);
    writeD<4>(this,uVar2,uVar1 | local_28);
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x10));
  }
  else {
    uVar2 = readD<1>(this,data);
    writeM<(moira::Core)2,(moira::Mode)2,1,0ull>(this,compare,uVar2);
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x13));
  }
  prefetch<(moira::Core)2,4ull>(this);
  return;
}

Assistant:

void
Moira::execCas(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    int dst = _____________xxx(opcode);
    int dc  = _____________xxx(queue.irc);
    int du  = _______xxx______(queue.irc);

    u32 ea, data;

    readExt<C>();
    readOp<C, M, S, STD_AE_FRAME>(dst, &ea, &data);

    auto compare = readD(dc);

    // Set flags
    cmp<C, S>(CLIP<S>(compare), data);

    if (!reg.sr.z) {

        writeD(dc, CLEAR<S>(compare) | data);

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_PI   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_PD   ( 0,  0, 17,        0,  0, 17,        0,  0, 17)
        CYCLES_DI   ( 0,  0, 17,        0,  0, 17,        0,  0, 17)
        CYCLES_IX   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_AW   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_AL   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)

    } else {

        writeM<C, M, S>(ea, readD<S>(du));

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_PI   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_PD   ( 0,  0, 20,        0,  0, 20,        0,  0, 20)
        CYCLES_DI   ( 0,  0, 20,        0,  0, 20,        0,  0, 20)
        CYCLES_IX   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_AW   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_AL   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
    }

    prefetch<C, POLL>();

    FINALIZE
}